

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_sse4.c
# Opt level: O3

void av1_highbd_dist_wtd_convolve_y_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params,
               int bd)

{
  int16_t *piVar1;
  undefined1 (*pauVar2) [16];
  undefined2 *puVar3;
  ushort *puVar4;
  undefined2 *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  CONV_BUF_TYPE *pCVar9;
  char cVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined2 uVar15;
  undefined2 uVar16;
  undefined2 uVar17;
  undefined2 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  uint16_t *puVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  uint16_t *puVar35;
  long lVar36;
  uint16_t *puVar37;
  int iVar38;
  long lVar39;
  CONV_BUF_TYPE *pCVar40;
  uint uVar41;
  uint16_t *puVar42;
  CONV_BUF_TYPE *pCVar43;
  int iVar44;
  ulong uVar45;
  int iVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  short sVar50;
  int iVar51;
  short sVar58;
  int iVar59;
  short sVar61;
  int iVar62;
  short sVar63;
  short sVar64;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar65;
  undefined1 auVar55 [16];
  short sVar57;
  short sVar60;
  undefined1 auVar56 [16];
  short sVar66;
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  int iVar97;
  int iVar101;
  int iVar102;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  int iVar103;
  undefined1 auVar100 [16];
  short sVar104;
  int iVar105;
  int iVar106;
  short sVar112;
  short sVar113;
  int iVar114;
  short sVar116;
  short sVar117;
  int iVar118;
  short sVar120;
  short sVar121;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  int iVar115;
  int iVar119;
  int iVar122;
  int iVar123;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  short sVar124;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  short local_138;
  short sStack_136;
  undefined1 local_c8 [16];
  undefined2 local_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined1 auVar68 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  
  iVar38 = conv_params->round_1 + conv_params->round_0;
  cVar10 = (char)bd - (char)iVar38;
  uVar29 = 0xff;
  if (bd == 0xc) {
    uVar29 = 0xfff;
  }
  uVar41 = 0x3ff;
  if (bd != 10) {
    uVar41 = uVar29;
  }
  if (0 < w) {
    iVar44 = 7 - conv_params->round_0;
    pCVar9 = conv_params->dst;
    lVar36 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
    iVar6 = conv_params->fwd_offset;
    iVar7 = conv_params->bck_offset;
    iVar46 = (1 << ((byte)conv_params->round_1 & 0x1f)) >> 1;
    auVar47 = ZEXT416((uint)conv_params->round_1);
    iVar27 = (1 << (cVar10 + 0xdU & 0x1f)) + (1 << (cVar10 + 0xeU & 0x1f));
    uVar29 = 0xe - iVar38;
    auVar48 = pshuflw(ZEXT416(uVar41),ZEXT416(uVar41),0);
    lVar39 = (long)conv_params->dst_stride;
    piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)filter_params_y->taps;
    uVar11 = *(undefined4 *)piVar1;
    uVar12 = *(undefined4 *)(piVar1 + 2);
    uVar13 = *(undefined4 *)(piVar1 + 4);
    uVar14 = *(undefined4 *)(piVar1 + 6);
    iVar38 = conv_params->do_average;
    iVar8 = conv_params->use_dist_wtd_comp_avg;
    lVar34 = (long)src_stride;
    iVar31 = ((1 << ((byte)uVar29 & 0x1f)) >> 1) - iVar27;
    auVar107._4_4_ = uVar12;
    auVar107._0_4_ = uVar12;
    auVar107._8_4_ = uVar12;
    auVar107._12_4_ = uVar12;
    lVar32 = (long)dst_stride0;
    lVar33 = 0;
    uVar45 = 0;
    do {
      if (0 < h) {
        pauVar2 = (undefined1 (*) [16])(src + (uVar45 - lVar36));
        auVar70 = *(undefined1 (*) [16])(*pauVar2 + (long)(src_stride * 5) * 2);
        puVar5 = (undefined2 *)(*pauVar2 + (long)(src_stride * 6) * 2);
        local_b8 = *puVar5;
        uStack_b6 = puVar5[1];
        uStack_b4 = puVar5[2];
        uStack_b2 = puVar5[3];
        puVar3 = (undefined2 *)(*pauVar2 + (long)(src_stride * 3) * 2);
        auVar74 = *(undefined1 (*) [16])(*pauVar2 + (long)(src_stride * 4) * 2);
        auVar49 = *(undefined1 (*) [16])(*pauVar2 + lVar34 * 2);
        auVar91 = *(undefined1 (*) [16])(*pauVar2 + (long)(src_stride * 2) * 2);
        auVar52 = *pauVar2;
        auVar96._2_2_ = auVar49._8_2_;
        auVar96._0_2_ = auVar52._8_2_;
        auVar96._4_2_ = auVar52._10_2_;
        auVar96._6_2_ = auVar49._10_2_;
        auVar96._8_2_ = auVar52._12_2_;
        auVar96._10_2_ = auVar49._12_2_;
        auVar96._12_2_ = auVar52._14_2_;
        auVar96._14_2_ = auVar49._14_2_;
        auVar108._0_12_ = auVar52._0_12_;
        auVar108._12_2_ = auVar52._6_2_;
        auVar108._14_2_ = auVar49._6_2_;
        auVar83._12_4_ = auVar108._12_4_;
        auVar83._0_10_ = auVar52._0_10_;
        auVar83._10_2_ = auVar49._4_2_;
        auVar82._10_6_ = auVar83._10_6_;
        auVar82._0_8_ = auVar52._0_8_;
        auVar82._8_2_ = auVar52._4_2_;
        auVar53._8_8_ = auVar82._8_8_;
        auVar53._6_2_ = auVar49._2_2_;
        auVar53._4_2_ = auVar52._2_2_;
        auVar53._0_2_ = auVar52._0_2_;
        auVar53._2_2_ = auVar49._0_2_;
        auVar84._2_2_ = auVar91._8_2_;
        auVar84._0_2_ = auVar49._8_2_;
        auVar84._4_2_ = auVar49._10_2_;
        auVar84._6_2_ = auVar91._10_2_;
        auVar84._8_2_ = auVar49._12_2_;
        auVar84._10_2_ = auVar91._12_2_;
        auVar84._12_2_ = auVar49._14_2_;
        auVar84._14_2_ = auVar91._14_2_;
        auVar88._0_12_ = auVar49._0_12_;
        auVar88._12_2_ = auVar49._6_2_;
        auVar88._14_2_ = auVar91._6_2_;
        auVar87._12_4_ = auVar88._12_4_;
        auVar87._0_10_ = auVar49._0_10_;
        auVar87._10_2_ = auVar91._4_2_;
        auVar86._10_6_ = auVar87._10_6_;
        auVar86._0_8_ = auVar49._0_8_;
        auVar86._8_2_ = auVar49._4_2_;
        auVar79._8_8_ = auVar86._8_8_;
        auVar79._6_2_ = auVar91._2_2_;
        auVar79._4_2_ = auVar49._2_2_;
        auVar52._0_2_ = auVar91._0_2_;
        auVar79._2_2_ = auVar52._0_2_;
        auVar79._0_2_ = auVar49._0_2_;
        auVar49._2_2_ = puVar3[4];
        auVar49._0_2_ = auVar91._8_2_;
        auVar49._4_2_ = auVar91._10_2_;
        auVar49._6_2_ = puVar3[5];
        auVar49._8_2_ = auVar91._12_2_;
        auVar49._10_2_ = puVar3[6];
        auVar49._12_2_ = auVar91._14_2_;
        auVar49._14_2_ = puVar3[7];
        auVar73._0_12_ = auVar91._0_12_;
        auVar73._12_2_ = auVar91._6_2_;
        auVar73._14_2_ = puVar3[3];
        auVar68._12_4_ = auVar73._12_4_;
        auVar68._0_10_ = auVar91._0_10_;
        auVar68._10_2_ = puVar3[2];
        auVar67._10_6_ = auVar68._10_6_;
        auVar67._0_8_ = auVar91._0_8_;
        auVar67._8_2_ = auVar91._4_2_;
        auVar52._8_8_ = auVar67._8_8_;
        auVar52._6_2_ = puVar3[1];
        auVar52._4_2_ = auVar91._2_2_;
        auVar52._2_2_ = *puVar3;
        auVar95._2_2_ = auVar74._8_2_;
        auVar95._0_2_ = puVar3[4];
        auVar95._4_2_ = puVar3[5];
        auVar95._6_2_ = auVar74._10_2_;
        auVar95._8_2_ = puVar3[6];
        auVar95._10_2_ = auVar74._12_2_;
        auVar95._12_2_ = puVar3[7];
        auVar95._14_2_ = auVar74._14_2_;
        auVar91._0_2_ = auVar74._0_2_;
        local_1f8._2_2_ = auVar91._0_2_;
        local_1f8._0_2_ = *puVar3;
        local_1f8._4_2_ = puVar3[1];
        local_1f8._6_2_ = auVar74._2_2_;
        local_1f8._8_2_ = puVar3[2];
        local_1f8._10_2_ = auVar74._4_2_;
        local_1f8._12_2_ = puVar3[3];
        local_1f8._14_2_ = auVar74._6_2_;
        local_208._2_2_ = auVar70._8_2_;
        local_208._0_2_ = auVar74._8_2_;
        local_208._4_2_ = auVar74._10_2_;
        local_208._6_2_ = auVar70._10_2_;
        local_208._8_2_ = auVar74._12_2_;
        local_208._10_2_ = auVar70._12_2_;
        local_208._12_2_ = auVar74._14_2_;
        local_208._14_2_ = auVar70._14_2_;
        auVar94._0_12_ = auVar74._0_12_;
        auVar94._12_2_ = auVar74._6_2_;
        auVar94._14_2_ = auVar70._6_2_;
        auVar93._12_4_ = auVar94._12_4_;
        auVar93._0_10_ = auVar74._0_10_;
        auVar93._10_2_ = auVar70._4_2_;
        auVar92._10_6_ = auVar93._10_6_;
        auVar92._0_8_ = auVar74._0_8_;
        auVar92._8_2_ = auVar74._4_2_;
        auVar91._8_8_ = auVar92._8_8_;
        auVar91._6_2_ = auVar70._2_2_;
        auVar91._4_2_ = auVar74._2_2_;
        auVar91._2_2_ = auVar70._0_2_;
        local_c8._2_2_ = puVar5[4];
        local_c8._0_2_ = auVar70._8_2_;
        local_c8._4_2_ = auVar70._10_2_;
        local_c8._6_2_ = puVar5[5];
        local_c8._8_2_ = auVar70._12_2_;
        local_c8._10_2_ = puVar5[6];
        local_c8._12_2_ = auVar70._14_2_;
        local_c8._14_2_ = puVar5[7];
        auVar89._0_12_ = auVar70._0_12_;
        auVar89._12_2_ = auVar70._6_2_;
        auVar89._14_2_ = uStack_b2;
        auVar80._12_4_ = auVar89._12_4_;
        auVar80._0_10_ = auVar70._0_10_;
        auVar80._10_2_ = uStack_b4;
        auVar78._10_6_ = auVar80._10_6_;
        auVar78._0_8_ = auVar70._0_8_;
        auVar78._8_2_ = auVar70._4_2_;
        auVar74._8_8_ = auVar78._8_8_;
        auVar74._6_2_ = uStack_b6;
        auVar74._4_2_ = auVar70._2_2_;
        auVar74._2_2_ = local_b8;
        auVar74._0_2_ = auVar70._0_2_;
        lVar30 = 0;
        puVar28 = src + (src_stride * 7 - lVar36);
        puVar35 = dst0 + lVar32;
        puVar37 = dst0;
        pCVar40 = pCVar9;
        puVar42 = src + (src_stride * 8 - lVar36);
        pCVar43 = pCVar9 + lVar39;
        uStack_b0 = puVar5[4];
        uStack_ae = puVar5[5];
        uStack_ac = puVar5[6];
        uStack_aa = puVar5[7];
        do {
          auVar80 = auVar74;
          auVar68 = auVar49;
          auVar67 = auVar52;
          auVar70 = *(undefined1 (*) [16])((long)puVar28 + lVar33);
          auVar81._8_8_ =
               (undefined8)
               (CONCAT64(CONCAT42(CONCAT22(auVar70._6_2_,uStack_b2),auVar70._4_2_),
                         CONCAT22(uStack_b4,uStack_b2)) >> 0x10);
          auVar81._6_2_ = auVar70._2_2_;
          auVar81._4_2_ = uStack_b6;
          auVar81._2_2_ = auVar70._0_2_;
          auVar81._0_2_ = local_b8;
          auVar26._4_4_ = uVar11;
          auVar26._0_4_ = uVar11;
          auVar26._8_4_ = uVar11;
          auVar26._12_4_ = uVar11;
          auVar52 = pmaddwd(auVar53,auVar26);
          auVar73 = pmaddwd(auVar67,auVar107);
          auVar25._4_4_ = uVar13;
          auVar25._0_4_ = uVar13;
          auVar25._8_4_ = uVar13;
          auVar25._12_4_ = uVar13;
          auVar78 = pmaddwd(auVar91,auVar25);
          auVar24._4_4_ = uVar14;
          auVar24._0_4_ = uVar14;
          auVar24._8_4_ = uVar14;
          auVar24._12_4_ = uVar14;
          auVar53 = pmaddwd(auVar81,auVar24);
          auVar89 = pmaddwd(auVar79,auVar26);
          auVar49 = pmaddwd(local_1f8,auVar107);
          auVar79 = pmaddwd(auVar80,auVar25);
          puVar5 = (undefined2 *)((long)puVar42 + lVar33);
          local_b8 = *puVar5;
          uStack_b6 = puVar5[1];
          uStack_b4 = puVar5[2];
          uStack_b2 = puVar5[3];
          uVar15 = puVar5[4];
          uVar16 = puVar5[5];
          uVar17 = puVar5[6];
          uVar18 = puVar5[7];
          auVar77._0_12_ = auVar70._0_12_;
          auVar77._12_2_ = auVar70._6_2_;
          auVar77._14_2_ = uStack_b2;
          auVar76._12_4_ = auVar77._12_4_;
          auVar76._0_10_ = auVar70._0_10_;
          auVar76._10_2_ = uStack_b4;
          auVar75._10_6_ = auVar76._10_6_;
          auVar75._0_8_ = auVar70._0_8_;
          auVar75._8_2_ = auVar70._4_2_;
          auVar74._8_8_ = auVar75._8_8_;
          auVar74._6_2_ = uStack_b6;
          auVar74._4_2_ = auVar70._2_2_;
          auVar74._2_2_ = local_b8;
          auVar74._0_2_ = auVar70._0_2_;
          auVar108 = pmaddwd(auVar74,auVar24);
          auVar98._2_2_ = auVar70._8_2_;
          auVar98._0_2_ = uStack_b0;
          auVar98._4_2_ = uStack_ae;
          auVar98._6_2_ = auVar70._10_2_;
          auVar98._8_2_ = uStack_ac;
          auVar98._10_2_ = auVar70._12_2_;
          auVar98._12_2_ = uStack_aa;
          auVar98._14_2_ = auVar70._14_2_;
          auVar69._2_2_ = uVar15;
          auVar69._0_2_ = auVar70._8_2_;
          auVar69._4_2_ = auVar70._10_2_;
          auVar69._6_2_ = uVar16;
          auVar69._8_2_ = auVar70._12_2_;
          auVar69._10_2_ = uVar17;
          auVar69._12_2_ = auVar70._14_2_;
          auVar69._14_2_ = uVar18;
          auVar70._4_4_ = iVar27;
          auVar70._0_4_ = iVar27;
          auVar70._8_4_ = iVar27;
          auVar70._12_4_ = iVar27;
          auVar54._0_4_ =
               ((auVar53._0_4_ + auVar78._0_4_ + auVar73._0_4_ + auVar52._0_4_ << iVar44) + iVar46
               >> auVar47) + iVar27;
          auVar54._4_4_ =
               (auVar53._4_4_ + auVar78._4_4_ + auVar73._4_4_ + auVar52._4_4_ + iVar46 >> auVar47) +
               iVar27;
          auVar54._8_4_ =
               (auVar53._8_4_ + auVar78._8_4_ + auVar73._8_4_ + auVar52._8_4_ + iVar46 >> auVar47) +
               iVar27;
          auVar54._12_4_ =
               (auVar53._12_4_ + auVar78._12_4_ + auVar73._12_4_ + auVar52._12_4_ + iVar46 >>
               auVar47) + iVar27;
          auVar109._0_4_ =
               ((auVar108._0_4_ + auVar79._0_4_ + auVar49._0_4_ + auVar89._0_4_ << iVar44) + iVar46
               >> auVar47) + iVar27;
          auVar109._4_4_ =
               (auVar108._4_4_ + auVar79._4_4_ + auVar49._4_4_ + auVar89._4_4_ + iVar46 >> auVar47)
               + iVar27;
          auVar109._8_4_ =
               (auVar108._8_4_ + auVar79._8_4_ + auVar49._8_4_ + auVar89._8_4_ + iVar46 >> auVar47)
               + iVar27;
          auVar109._12_4_ =
               (auVar108._12_4_ + auVar79._12_4_ + auVar49._12_4_ + auVar89._12_4_ + iVar46 >>
               auVar47) + iVar27;
          local_138 = auVar48._0_2_;
          sStack_136 = auVar48._2_2_;
          if ((long)((ulong)(uint)w - 8) < (long)uVar45) {
            if (iVar38 == 0) {
              auVar70 = packusdw(auVar54,auVar54);
              auVar49 = packusdw(auVar109,auVar109);
              *(long *)((long)pCVar40 + lVar33) = auVar70._0_8_;
              *(long *)((long)pCVar43 + lVar33) = auVar49._0_8_;
            }
            else {
              auVar49 = pmovzxwd(auVar70,*(undefined8 *)((long)pCVar40 + lVar33));
              auVar70 = pmovzxwd(auVar69,*(undefined8 *)((long)pCVar43 + lVar33));
              if (iVar8 == 0) {
                iVar51 = auVar54._0_4_ + auVar49._0_4_ >> 1;
                iVar59 = auVar54._4_4_ + auVar49._4_4_ >> 1;
                iVar62 = auVar54._8_4_ + auVar49._8_4_ >> 1;
                iVar65 = auVar54._12_4_ + auVar49._12_4_ >> 1;
                iVar105 = auVar109._0_4_ + auVar70._0_4_ >> 1;
                iVar114 = auVar109._4_4_ + auVar70._4_4_ >> 1;
                iVar118 = auVar109._8_4_ + auVar70._8_4_ >> 1;
                iVar122 = auVar109._12_4_ + auVar70._12_4_ >> 1;
              }
              else {
                auVar21._4_4_ = iVar6;
                auVar21._0_4_ = iVar6;
                auVar21._8_4_ = iVar6;
                auVar21._12_4_ = iVar6;
                auVar52 = pmulld(auVar49,auVar21);
                auVar19._4_4_ = iVar7;
                auVar19._0_4_ = iVar7;
                auVar19._8_4_ = iVar7;
                auVar19._12_4_ = iVar7;
                auVar49 = pmulld(auVar54,auVar19);
                iVar51 = auVar49._0_4_ + auVar52._0_4_ >> 4;
                iVar59 = auVar49._4_4_ + auVar52._4_4_ >> 4;
                iVar62 = auVar49._8_4_ + auVar52._8_4_ >> 4;
                iVar65 = auVar49._12_4_ + auVar52._12_4_ >> 4;
                auVar70 = pmulld(auVar70,auVar21);
                auVar49 = pmulld(auVar109,auVar19);
                iVar105 = auVar49._0_4_ + auVar70._0_4_ >> 4;
                iVar114 = auVar49._4_4_ + auVar70._4_4_ >> 4;
                iVar118 = auVar49._8_4_ + auVar70._8_4_ >> 4;
                iVar122 = auVar49._12_4_ + auVar70._12_4_ >> 4;
              }
              auVar70 = ZEXT416(uVar29);
              auVar55._0_4_ = iVar51 + iVar31 >> auVar70;
              auVar55._4_4_ = iVar59 + iVar31 >> auVar70;
              auVar55._8_4_ = iVar62 + iVar31 >> auVar70;
              auVar55._12_4_ = iVar65 + iVar31 >> auVar70;
              auVar110._0_4_ = iVar105 + iVar31 >> auVar70;
              auVar110._4_4_ = iVar114 + iVar31 >> auVar70;
              auVar110._8_4_ = iVar118 + iVar31 >> auVar70;
              auVar110._12_4_ = iVar122 + iVar31 >> auVar70;
              auVar70 = packusdw(auVar55,auVar55);
              sVar50 = auVar70._0_2_;
              sVar57 = auVar70._2_2_;
              sVar58 = auVar70._4_2_;
              sVar60 = auVar70._6_2_;
              auVar70 = packusdw(auVar110,auVar110);
              sVar61 = auVar70._0_2_;
              sVar63 = auVar70._2_2_;
              sVar64 = auVar70._4_2_;
              sVar66 = auVar70._6_2_;
              *(ulong *)((long)puVar37 + lVar33) =
                   CONCAT26((ushort)(sStack_136 < sVar60) * sStack_136 |
                            (ushort)(sStack_136 >= sVar60) * sVar60,
                            CONCAT24((ushort)(local_138 < sVar58) * local_138 |
                                     (ushort)(local_138 >= sVar58) * sVar58,
                                     CONCAT22((ushort)(sStack_136 < sVar57) * sStack_136 |
                                              (ushort)(sStack_136 >= sVar57) * sVar57,
                                              (ushort)(local_138 < sVar50) * local_138 |
                                              (ushort)(local_138 >= sVar50) * sVar50)));
              *(ulong *)((long)puVar35 + lVar33) =
                   CONCAT26((ushort)(sStack_136 < sVar66) * sStack_136 |
                            (ushort)(sStack_136 >= sVar66) * sVar66,
                            CONCAT24((ushort)(local_138 < sVar64) * local_138 |
                                     (ushort)(local_138 >= sVar64) * sVar64,
                                     CONCAT22((ushort)(sStack_136 < sVar63) * sStack_136 |
                                              (ushort)(sStack_136 >= sVar63) * sVar63,
                                              (ushort)(local_138 < sVar61) * local_138 |
                                              (ushort)(local_138 >= sVar61) * sVar61)));
            }
          }
          else {
            auVar53 = pmaddwd(auVar96,auVar26);
            auVar79 = pmaddwd(auVar68,auVar107);
            auVar96 = pmaddwd(local_208,auVar25);
            auVar73 = pmaddwd(auVar98,auVar24);
            auVar52 = pmaddwd(auVar84,auVar26);
            auVar49 = pmaddwd(auVar95,auVar107);
            auVar84 = pmaddwd(local_c8,auVar25);
            auVar70 = pmaddwd(auVar69,auVar24);
            auVar23._4_4_ = iVar46;
            auVar23._0_4_ = iVar46;
            auVar23._8_4_ = iVar46;
            auVar23._12_4_ = iVar46;
            auVar99._0_4_ =
                 ((auVar73._0_4_ + auVar96._0_4_ + auVar79._0_4_ + auVar53._0_4_ << iVar44) + iVar46
                 >> auVar47) + iVar27;
            auVar99._4_4_ =
                 (auVar73._4_4_ + auVar96._4_4_ + auVar79._4_4_ + auVar53._4_4_ + iVar46 >> auVar47)
                 + iVar27;
            auVar99._8_4_ =
                 (auVar73._8_4_ + auVar96._8_4_ + auVar79._8_4_ + auVar53._8_4_ + iVar46 >> auVar47)
                 + iVar27;
            auVar99._12_4_ =
                 (auVar73._12_4_ + auVar96._12_4_ + auVar79._12_4_ + auVar53._12_4_ + iVar46 >>
                 auVar47) + iVar27;
            auVar71._0_4_ =
                 ((auVar70._0_4_ + auVar84._0_4_ + auVar49._0_4_ + auVar52._0_4_ << iVar44) + iVar46
                 >> auVar47) + iVar27;
            auVar71._4_4_ =
                 (auVar70._4_4_ + auVar84._4_4_ + auVar49._4_4_ + auVar52._4_4_ + iVar46 >> auVar47)
                 + iVar27;
            auVar71._8_4_ =
                 (auVar70._8_4_ + auVar84._8_4_ + auVar49._8_4_ + auVar52._8_4_ + iVar46 >> auVar47)
                 + iVar27;
            auVar71._12_4_ =
                 (auVar70._12_4_ + auVar84._12_4_ + auVar49._12_4_ + auVar52._12_4_ + iVar46 >>
                 auVar47) + iVar27;
            if (iVar38 == 0) {
              auVar70 = packusdw(auVar54,auVar99);
              auVar49 = packusdw(auVar109,auVar71);
              *(undefined1 (*) [16])((long)pCVar40 + lVar33) = auVar70;
              *(undefined1 (*) [16])((long)pCVar43 + lVar33) = auVar49;
            }
            else {
              auVar70 = *(undefined1 (*) [16])((long)pCVar40 + lVar33);
              auVar49 = *(undefined1 (*) [16])((long)pCVar43 + lVar33);
              auVar53 = pmovzxwd(auVar47,auVar70);
              auVar52 = pmovzxwd(auVar23,auVar49);
              auVar85._0_4_ = CONCAT22(0,auVar70._8_2_);
              auVar85._4_2_ = auVar70._10_2_;
              auVar85._6_2_ = 0;
              auVar85._8_2_ = auVar70._12_2_;
              auVar85._10_2_ = 0;
              auVar85._12_2_ = auVar70._14_2_;
              auVar85._14_2_ = 0;
              auVar90._0_4_ = CONCAT22(0,auVar49._8_2_);
              auVar90._4_2_ = auVar49._10_2_;
              auVar90._6_2_ = 0;
              auVar90._8_2_ = auVar49._12_2_;
              auVar90._10_2_ = 0;
              auVar90._12_2_ = auVar49._14_2_;
              auVar90._14_2_ = 0;
              if (iVar8 == 0) {
                iVar51 = auVar54._0_4_ + auVar53._0_4_ >> 1;
                iVar59 = auVar54._4_4_ + auVar53._4_4_ >> 1;
                iVar62 = auVar54._8_4_ + auVar53._8_4_ >> 1;
                iVar65 = auVar54._12_4_ + auVar53._12_4_ >> 1;
                iVar106 = auVar109._0_4_ + auVar52._0_4_ >> 1;
                iVar115 = auVar109._4_4_ + auVar52._4_4_ >> 1;
                iVar119 = auVar109._8_4_ + auVar52._8_4_ >> 1;
                iVar123 = auVar109._12_4_ + auVar52._12_4_ >> 1;
                iVar97 = (int)(auVar99._0_4_ + auVar85._0_4_) >> 1;
                iVar101 = (int)(auVar99._4_4_ + (uint)auVar70._10_2_) >> 1;
                iVar102 = (int)(auVar99._8_4_ + (uint)auVar70._12_2_) >> 1;
                iVar103 = (int)(auVar99._12_4_ + (uint)auVar70._14_2_) >> 1;
                iVar105 = (int)(auVar71._0_4_ + auVar90._0_4_) >> 1;
                iVar114 = (int)(auVar71._4_4_ + (uint)auVar49._10_2_) >> 1;
                iVar118 = (int)(auVar71._8_4_ + (uint)auVar49._12_2_) >> 1;
                iVar122 = (int)(auVar71._12_4_ + (uint)auVar49._14_2_) >> 1;
              }
              else {
                auVar22._4_4_ = iVar6;
                auVar22._0_4_ = iVar6;
                auVar22._8_4_ = iVar6;
                auVar22._12_4_ = iVar6;
                auVar49 = pmulld(auVar53,auVar22);
                auVar20._4_4_ = iVar7;
                auVar20._0_4_ = iVar7;
                auVar20._8_4_ = iVar7;
                auVar20._12_4_ = iVar7;
                auVar70 = pmulld(auVar54,auVar20);
                iVar51 = auVar70._0_4_ + auVar49._0_4_ >> 4;
                iVar59 = auVar70._4_4_ + auVar49._4_4_ >> 4;
                iVar62 = auVar70._8_4_ + auVar49._8_4_ >> 4;
                iVar65 = auVar70._12_4_ + auVar49._12_4_ >> 4;
                auVar70 = pmulld(auVar52,auVar22);
                auVar49 = pmulld(auVar109,auVar20);
                iVar106 = auVar49._0_4_ + auVar70._0_4_ >> 4;
                iVar115 = auVar49._4_4_ + auVar70._4_4_ >> 4;
                iVar119 = auVar49._8_4_ + auVar70._8_4_ >> 4;
                iVar123 = auVar49._12_4_ + auVar70._12_4_ >> 4;
                auVar70 = pmulld(auVar85,auVar22);
                auVar49 = pmulld(auVar99,auVar20);
                iVar97 = auVar49._0_4_ + auVar70._0_4_ >> 4;
                iVar101 = auVar49._4_4_ + auVar70._4_4_ >> 4;
                iVar102 = auVar49._8_4_ + auVar70._8_4_ >> 4;
                iVar103 = auVar49._12_4_ + auVar70._12_4_ >> 4;
                auVar49 = pmulld(auVar90,auVar22);
                auVar70 = pmulld(auVar71,auVar20);
                iVar105 = auVar70._0_4_ + auVar49._0_4_ >> 4;
                iVar114 = auVar70._4_4_ + auVar49._4_4_ >> 4;
                iVar118 = auVar70._8_4_ + auVar49._8_4_ >> 4;
                iVar122 = auVar70._12_4_ + auVar49._12_4_ >> 4;
              }
              auVar49 = ZEXT416(uVar29);
              auVar56._0_4_ = iVar51 + iVar31 >> auVar49;
              auVar56._4_4_ = iVar59 + iVar31 >> auVar49;
              auVar56._8_4_ = iVar62 + iVar31 >> auVar49;
              auVar56._12_4_ = iVar65 + iVar31 >> auVar49;
              auVar111._0_4_ = iVar106 + iVar31 >> auVar49;
              auVar111._4_4_ = iVar115 + iVar31 >> auVar49;
              auVar111._8_4_ = iVar119 + iVar31 >> auVar49;
              auVar111._12_4_ = iVar123 + iVar31 >> auVar49;
              auVar100._0_4_ = iVar97 + iVar31 >> auVar49;
              auVar100._4_4_ = iVar101 + iVar31 >> auVar49;
              auVar100._8_4_ = iVar102 + iVar31 >> auVar49;
              auVar100._12_4_ = iVar103 + iVar31 >> auVar49;
              auVar70 = packusdw(auVar56,auVar100);
              auVar72._0_4_ = iVar105 + iVar31 >> auVar49;
              auVar72._4_4_ = iVar114 + iVar31 >> auVar49;
              auVar72._8_4_ = iVar118 + iVar31 >> auVar49;
              auVar72._12_4_ = iVar122 + iVar31 >> auVar49;
              auVar49 = packusdw(auVar111,auVar72);
              sVar50 = auVar70._0_2_;
              sVar57 = auVar70._2_2_;
              sVar58 = auVar70._4_2_;
              sVar60 = auVar70._6_2_;
              sVar61 = auVar70._8_2_;
              sVar63 = auVar70._10_2_;
              sVar64 = auVar70._12_2_;
              sVar66 = auVar70._14_2_;
              sVar104 = auVar49._0_2_;
              sVar112 = auVar49._2_2_;
              sVar113 = auVar49._4_2_;
              sVar116 = auVar49._6_2_;
              sVar117 = auVar49._8_2_;
              sVar120 = auVar49._10_2_;
              sVar121 = auVar49._12_2_;
              sVar124 = auVar49._14_2_;
              puVar4 = (ushort *)((long)puVar37 + lVar33);
              *puVar4 = (ushort)(local_138 < sVar50) * local_138 |
                        (ushort)(local_138 >= sVar50) * sVar50;
              puVar4[1] = (ushort)(sStack_136 < sVar57) * sStack_136 |
                          (ushort)(sStack_136 >= sVar57) * sVar57;
              puVar4[2] = (ushort)(local_138 < sVar58) * local_138 |
                          (ushort)(local_138 >= sVar58) * sVar58;
              puVar4[3] = (ushort)(sStack_136 < sVar60) * sStack_136 |
                          (ushort)(sStack_136 >= sVar60) * sVar60;
              puVar4[4] = (ushort)(local_138 < sVar61) * local_138 |
                          (ushort)(local_138 >= sVar61) * sVar61;
              puVar4[5] = (ushort)(sStack_136 < sVar63) * sStack_136 |
                          (ushort)(sStack_136 >= sVar63) * sVar63;
              puVar4[6] = (ushort)(local_138 < sVar64) * local_138 |
                          (ushort)(local_138 >= sVar64) * sVar64;
              puVar4[7] = (ushort)(sStack_136 < sVar66) * sStack_136 |
                          (ushort)(sStack_136 >= sVar66) * sVar66;
              puVar4 = (ushort *)((long)puVar35 + lVar33);
              *puVar4 = (ushort)(local_138 < sVar104) * local_138 |
                        (ushort)(local_138 >= sVar104) * sVar104;
              puVar4[1] = (ushort)(sStack_136 < sVar112) * sStack_136 |
                          (ushort)(sStack_136 >= sVar112) * sVar112;
              puVar4[2] = (ushort)(local_138 < sVar113) * local_138 |
                          (ushort)(local_138 >= sVar113) * sVar113;
              puVar4[3] = (ushort)(sStack_136 < sVar116) * sStack_136 |
                          (ushort)(sStack_136 >= sVar116) * sVar116;
              puVar4[4] = (ushort)(local_138 < sVar117) * local_138 |
                          (ushort)(local_138 >= sVar117) * sVar117;
              puVar4[5] = (ushort)(sStack_136 < sVar120) * sStack_136 |
                          (ushort)(sStack_136 >= sVar120) * sVar120;
              puVar4[6] = (ushort)(local_138 < sVar121) * local_138 |
                          (ushort)(local_138 >= sVar121) * sVar121;
              puVar4[7] = (ushort)(sStack_136 < sVar124) * sStack_136 |
                          (ushort)(sStack_136 >= sVar124) * sVar124;
            }
          }
          lVar30 = lVar30 + 2;
          pCVar43 = pCVar43 + lVar39 * 2;
          pCVar40 = pCVar40 + lVar39 * 2;
          puVar35 = puVar35 + lVar32 * 2;
          puVar37 = puVar37 + lVar32 * 2;
          puVar42 = puVar42 + lVar34 * 2;
          puVar28 = puVar28 + lVar34 * 2;
          auVar52 = auVar91;
          auVar49 = local_208;
          auVar53 = auVar67;
          auVar84 = auVar95;
          auVar79 = local_1f8;
          auVar91 = auVar81;
          auVar95 = local_c8;
          auVar96 = auVar68;
          local_208 = auVar98;
          local_1f8 = auVar80;
          local_c8 = auVar69;
          uStack_b0 = uVar15;
          uStack_ae = uVar16;
          uStack_ac = uVar17;
          uStack_aa = uVar18;
        } while (lVar30 < h);
      }
      uVar45 = uVar45 + 8;
      lVar33 = lVar33 + 0x10;
    } while (uVar45 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_y_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_y, const int subpel_y_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS - conv_params->round_0;

  assert(bits >= 0);
  int i, j;
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);
  const __m128i round_const_y =
      _mm_set1_epi32(((1 << conv_params->round_1) >> 1));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i zero = _mm_setzero_si128();
  __m128i s[16], coeffs_y[4];

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    const uint16_t *data = &src_ptr[j];
    /* Vertical filter */
    {
      __m128i s0 = _mm_loadu_si128((__m128i *)(data + 0 * src_stride));
      __m128i s1 = _mm_loadu_si128((__m128i *)(data + 1 * src_stride));
      __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_stride));
      __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_stride));
      __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_stride));
      __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_stride));
      __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_stride));

      s[0] = _mm_unpacklo_epi16(s0, s1);
      s[1] = _mm_unpacklo_epi16(s2, s3);
      s[2] = _mm_unpacklo_epi16(s4, s5);

      s[4] = _mm_unpackhi_epi16(s0, s1);
      s[5] = _mm_unpackhi_epi16(s2, s3);
      s[6] = _mm_unpackhi_epi16(s4, s5);

      s[0 + 8] = _mm_unpacklo_epi16(s1, s2);
      s[1 + 8] = _mm_unpacklo_epi16(s3, s4);
      s[2 + 8] = _mm_unpacklo_epi16(s5, s6);

      s[4 + 8] = _mm_unpackhi_epi16(s1, s2);
      s[5 + 8] = _mm_unpackhi_epi16(s3, s4);
      s[6 + 8] = _mm_unpackhi_epi16(s5, s6);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        __m128i s7 = _mm_loadu_si128((__m128i *)(data + 7 * src_stride));
        __m128i s8 = _mm_loadu_si128((__m128i *)(data + 8 * src_stride));

        s[3] = _mm_unpacklo_epi16(s6, s7);
        s[7] = _mm_unpackhi_epi16(s6, s7);

        s[3 + 8] = _mm_unpacklo_epi16(s7, s8);
        s[7 + 8] = _mm_unpackhi_epi16(s7, s8);

        const __m128i res_a0 = convolve(s, coeffs_y);
        __m128i res_a_round0 = _mm_sll_epi32(res_a0, round_shift_bits);
        res_a_round0 = _mm_sra_epi32(_mm_add_epi32(res_a_round0, round_const_y),
                                     round_shift_y);

        const __m128i res_a1 = convolve(s + 8, coeffs_y);
        __m128i res_a_round1 = _mm_sll_epi32(res_a1, round_shift_bits);
        res_a_round1 = _mm_sra_epi32(_mm_add_epi32(res_a_round1, round_const_y),
                                     round_shift_y);

        __m128i res_unsigned_lo_0 = _mm_add_epi32(res_a_round0, offset_const);
        __m128i res_unsigned_lo_1 = _mm_add_epi32(res_a_round1, offset_const);

        if (w - j < 8) {
          if (do_average) {
            const __m128i data_0 =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
            const __m128i data_1 = _mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride]));

            const __m128i data_ref_0 = _mm_unpacklo_epi16(data_0, zero);
            const __m128i data_ref_1 = _mm_unpacklo_epi16(data_1, zero);

            const __m128i comp_avg_res_0 =
                highbd_comp_avg_sse4_1(&data_ref_0, &res_unsigned_lo_0, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_1 =
                highbd_comp_avg_sse4_1(&data_ref_1, &res_unsigned_lo_1, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result_0 =
                highbd_convolve_rounding_sse2(&comp_avg_res_0, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_1 =
                highbd_convolve_rounding_sse2(&comp_avg_res_1, &offset_const,
                                              &rounding_const, rounding_shift);

            const __m128i res_16b_0 =
                _mm_packus_epi32(round_result_0, round_result_0);
            const __m128i res_clip_0 =
                _mm_min_epi16(res_16b_0, clip_pixel_to_bd);
            const __m128i res_16b_1 =
                _mm_packus_epi32(round_result_1, round_result_1);
            const __m128i res_clip_1 =
                _mm_min_epi16(res_16b_1, clip_pixel_to_bd);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]),
                             res_clip_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]),
                res_clip_1);

          } else {
            __m128i res_16b_0 =
                _mm_packus_epi32(res_unsigned_lo_0, res_unsigned_lo_0);

            __m128i res_16b_1 =
                _mm_packus_epi32(res_unsigned_lo_1, res_unsigned_lo_1);

            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_16b_0);
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                             res_16b_1);
          }
        } else {
          const __m128i res_b0 = convolve(s + 4, coeffs_y);
          __m128i res_b_round0 = _mm_sll_epi32(res_b0, round_shift_bits);
          res_b_round0 = _mm_sra_epi32(
              _mm_add_epi32(res_b_round0, round_const_y), round_shift_y);

          const __m128i res_b1 = convolve(s + 4 + 8, coeffs_y);
          __m128i res_b_round1 = _mm_sll_epi32(res_b1, round_shift_bits);
          res_b_round1 = _mm_sra_epi32(
              _mm_add_epi32(res_b_round1, round_const_y), round_shift_y);

          __m128i res_unsigned_hi_0 = _mm_add_epi32(res_b_round0, offset_const);
          __m128i res_unsigned_hi_1 = _mm_add_epi32(res_b_round1, offset_const);

          if (do_average) {
            const __m128i data_0 =
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));
            const __m128i data_1 = _mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride]));
            const __m128i data_ref_0_lo_0 = _mm_unpacklo_epi16(data_0, zero);
            const __m128i data_ref_0_lo_1 = _mm_unpacklo_epi16(data_1, zero);

            const __m128i data_ref_0_hi_0 = _mm_unpackhi_epi16(data_0, zero);
            const __m128i data_ref_0_hi_1 = _mm_unpackhi_epi16(data_1, zero);

            const __m128i comp_avg_res_lo_0 =
                highbd_comp_avg_sse4_1(&data_ref_0_lo_0, &res_unsigned_lo_0,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_lo_1 =
                highbd_comp_avg_sse4_1(&data_ref_0_lo_1, &res_unsigned_lo_1,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_hi_0 =
                highbd_comp_avg_sse4_1(&data_ref_0_hi_0, &res_unsigned_hi_0,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_hi_1 =
                highbd_comp_avg_sse4_1(&data_ref_0_hi_1, &res_unsigned_hi_1,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result_lo_0 =
                highbd_convolve_rounding_sse2(&comp_avg_res_lo_0, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_lo_1 =
                highbd_convolve_rounding_sse2(&comp_avg_res_lo_1, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_hi_0 =
                highbd_convolve_rounding_sse2(&comp_avg_res_hi_0, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_hi_1 =
                highbd_convolve_rounding_sse2(&comp_avg_res_hi_1, &offset_const,
                                              &rounding_const, rounding_shift);

            const __m128i res_16b_0 =
                _mm_packus_epi32(round_result_lo_0, round_result_hi_0);
            const __m128i res_clip_0 =
                _mm_min_epi16(res_16b_0, clip_pixel_to_bd);

            const __m128i res_16b_1 =
                _mm_packus_epi32(round_result_lo_1, round_result_hi_1);
            const __m128i res_clip_1 =
                _mm_min_epi16(res_16b_1, clip_pixel_to_bd);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]),
                            res_clip_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]),
                res_clip_1);
          } else {
            __m128i res_16bit0 =
                _mm_packus_epi32(res_unsigned_lo_0, res_unsigned_hi_0);
            __m128i res_16bit1 =
                _mm_packus_epi32(res_unsigned_lo_1, res_unsigned_hi_1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_16bit0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_16bit1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];

        s[0 + 8] = s[1 + 8];
        s[1 + 8] = s[2 + 8];
        s[2 + 8] = s[3 + 8];

        s[4 + 8] = s[5 + 8];
        s[5 + 8] = s[6 + 8];
        s[6 + 8] = s[7 + 8];

        s6 = s8;
      }
    }
  }
}